

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calc.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  long lVar1;
  pointer __value;
  undefined1 local_410 [8];
  fstream fileStream;
  undefined1 local_200 [8];
  CalcParser parser;
  
  Calc::CalcParser::CalcParser((CalcParser *)local_200);
  if (argc < 2) {
    Calc::CalcParser::Evaluate((CalcParser *)local_200,(istream *)&std::cin);
  }
  else {
    std::fstream::fstream(local_410,argv[1],_S_out|_S_in);
    Calc::CalcParser::Evaluate((CalcParser *)local_200,(istream *)local_410);
    std::fstream::~fstream(local_410);
  }
  local_410 = (undefined1  [8])&std::cout;
  _fileStream = " ";
  lVar1 = (long)parser.numbers.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start -
          (long)parser.table.ReduceProductions.
                super__Vector_base<SGParser::ParseTable::ReduceProduction,_std::allocator<SGParser::ParseTable::ReduceProduction>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage >> 2;
  if (0 < lVar1) {
    lVar1 = lVar1 + 1;
    __value = parser.table.ReduceProductions.
              super__Vector_base<SGParser::ParseTable::ReduceProduction,_std::allocator<SGParser::ParseTable::ReduceProduction>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    do {
      std::ostream_iterator<float,_char,_std::char_traits<char>_>::operator=
                ((ostream_iterator<float,_char,_std::char_traits<char>_> *)local_410,
                 (float *)__value);
      __value = __value + 1;
      lVar1 = lVar1 + -1;
    } while (1 < lVar1);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  Calc::CalcParser::~CalcParser((CalcParser *)local_200);
  return 0;
}

Assistant:

int main(int argc, char const* argv[]) {
    using namespace std;
    using namespace Calc;
    try {
        CalcParser parser;
        if (argc > 1) {
            fstream fileStream{argv[1]};
            parser.Evaluate(fileStream);
        } else {
            parser.Evaluate(cin);
        }
        auto const& numbers = parser.GetEvaluatedNumbers();
        copy(numbers.begin(), numbers.end(), ostream_iterator<CalcParser::Number>(cout, " "));
        cout << endl;
        return 0;
    } catch (exception const& failure) {
        cerr << failure.what() << endl;
        return 1;
    }
}